

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fPolygonOffsetTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_0::OneSlopeTestCase::testPolygonOffset(OneSlopeTestCase *this)

{
  ostringstream *poVar1;
  TextureFormat log;
  RenderContext *pRVar2;
  TestContext *testCtx;
  OneSlopeTestCase *pOVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 extraout_var;
  TestError *this_00;
  long lVar7;
  undefined4 uStack_364;
  undefined8 local_360;
  float local_358 [24];
  Surface referenceImage;
  Surface testImage;
  string local_2c8;
  string local_2a8;
  undefined1 local_288 [384];
  ShaderProgram program;
  
  iVar4 = (this->super_PolygonOffsetTestCase).m_targetSize;
  local_358[10] = (float)iVar4;
  local_358[2] = -local_358[10];
  local_358[0] = -1.0;
  local_358[1] = -1.0;
  local_358[3] = 1.0;
  local_358[4] = -1.0;
  local_358[5] = 1.0;
  local_358[7] = 1.0;
  local_358[8] = 1.0;
  local_358[9] = -1.0;
  local_358[0xb] = 1.0;
  local_358[0xc] = -1.0;
  local_358[0xd] = 1.0;
  local_358[0xf] = 1.0;
  local_358[0x10] = 1.0;
  local_358[0x11] = 1.0;
  local_358[0x13] = 1.0;
  local_358[0x14] = 1.0;
  local_358[0x15] = -1.0;
  local_358[0x17] = 1.0;
  log = (TextureFormat)
        ((this->super_PolygonOffsetTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
        ->m_log;
  local_358[6] = local_358[2];
  local_358[0xe] = local_358[10];
  local_358[0x12] = local_358[10];
  local_358[0x16] = local_358[2];
  tcu::Surface::Surface(&testImage,iVar4,iVar4);
  iVar4 = (this->super_PolygonOffsetTestCase).m_targetSize;
  tcu::Surface::Surface(&referenceImage,iVar4,iVar4);
  poVar1 = (ostringstream *)(local_288 + 8);
  local_288._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  local_360 = this;
  std::operator<<((ostream *)poVar1,
                  "Setup triangle0 coordinates: (slope in window coordinates = 1.0)");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  poVar1 = (ostringstream *)(local_288 + 8);
  for (lVar7 = 0xc; lVar7 != 0x3c; lVar7 = lVar7 + 0x10) {
    local_288._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"\tx=");
    std::ostream::operator<<(poVar1,*(float *)((long)&uStack_364 + lVar7));
    std::operator<<((ostream *)poVar1,"\ty=");
    std::ostream::operator<<(poVar1,*(float *)((long)&local_360 + lVar7));
    std::operator<<((ostream *)poVar1,"\tz=");
    std::ostream::operator<<(poVar1,*(float *)((long)&local_360 + lVar7 + 4));
    std::operator<<((ostream *)poVar1,"\tw=");
    std::ostream::operator<<(poVar1,*(float *)((long)local_358 + lVar7));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  poVar1 = (ostringstream *)(local_288 + 8);
  local_288._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,
                  "Setup triangle1 coordinates: (slope in window coordinates = 1.0)");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  poVar1 = (ostringstream *)(local_288 + 8);
  for (lVar7 = 0x3c; pOVar3 = local_360, lVar7 != 0x6c; lVar7 = lVar7 + 0x10) {
    local_288._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"\tx=");
    std::ostream::operator<<(poVar1,*(float *)((long)&uStack_364 + lVar7));
    std::operator<<((ostream *)poVar1,"\ty=");
    std::ostream::operator<<(poVar1,*(float *)((long)&local_360 + lVar7));
    std::operator<<((ostream *)poVar1,"\tz=");
    std::ostream::operator<<(poVar1,*(float *)((long)&local_360 + lVar7 + 4));
    std::operator<<((ostream *)poVar1,"\tw=");
    std::ostream::operator<<(poVar1,*(float *)((long)local_358 + lVar7));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  iVar4 = (*((local_360->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  pRVar2 = ((pOVar3->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,
             "attribute highp vec4 a_position;\nattribute highp vec4 a_color;\nvarying mediump vec4 v_color;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_color = a_color;\n}\n"
             ,(allocator<char> *)((long)&uStack_364 + 3));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c8,
             "varying mediump vec4 v_color;\nvoid main (void)\n{\n\tgl_FragColor = v_color;\n}\n",
             (allocator<char> *)((long)&uStack_364 + 2));
  glu::makeVtxFragSources((ProgramSources *)local_288,&local_2a8,&local_2c8);
  glu::ShaderProgram::ShaderProgram(&program,pRVar2,(ProgramSources *)local_288);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_288);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2a8);
  uVar5 = (**(code **)(lVar7 + 0x780))(program.m_program.m_program,"a_position");
  uVar6 = (**(code **)(lVar7 + 0x780))(program.m_program.m_program,"a_color");
  if (program.m_program.m_info.linkOk != false) {
    (**(code **)(lVar7 + 0x1c0))(0,0,0,0x3f800000);
    (**(code **)(lVar7 + 0x188))(0x4000);
    (**(code **)(lVar7 + 0x1a00))(0,0,(local_360->super_PolygonOffsetTestCase).m_targetSize);
    (**(code **)(lVar7 + 0x1680))(program.m_program.m_program);
    (**(code **)(lVar7 + 0x5e0))(0xb71);
    (**(code **)(lVar7 + 0x5e0))(0x8037);
    (**(code **)(lVar7 + 0x610))(uVar5);
    poVar1 = (ostringstream *)(local_288 + 8);
    local_288._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Framebuffer cleared, clear color = Black.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    poVar1 = (ostringstream *)(local_288 + 8);
    local_288._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"POLYGON_OFFSET_FILL enabled.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    poVar1 = (ostringstream *)(local_288 + 8);
    local_288._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Clear depth to 1.0.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar7 + 0x1d0))(0x3f800000);
    (**(code **)(lVar7 + 0x188))(0x100);
    (**(code **)(lVar7 + 0x19f0))(uVar5,4,0x1406,0,0,local_358);
    poVar1 = (ostringstream *)(local_288 + 8);
    local_288._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Draw triangle0. Color = Red.\tState: DepthFunc = NOTEQUAL, PolygonOffset(10, 0). (Result depth should clamp to 1.0)."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar7 + 0x1028))(0x41200000,0);
    (**(code **)(lVar7 + 0x4a0))(0x205);
    (**(code **)(lVar7 + 0x1858))(0x3f800000,0,0,0x3f800000,uVar6);
    (**(code **)(lVar7 + 0x538))(4,0,3);
    poVar1 = (ostringstream *)(local_288 + 8);
    local_288._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Clear depth to 0.0.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar7 + 0x1d0))(0);
    (**(code **)(lVar7 + 0x188))(0x100);
    (**(code **)(lVar7 + 0x19f0))(uVar5,4,0x1406,0,0,local_358 + 0xc);
    poVar1 = (ostringstream *)(local_288 + 8);
    local_288._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Draw triangle1. Color = Green.\tState: DepthFunc = NOTEQUAL, PolygonOffset(-10, 0). (Result depth should clamp to 0.0)."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar7 + 0x1028))(0xc1200000,0);
    (**(code **)(lVar7 + 0x4a0))(0x205);
    (**(code **)(lVar7 + 0x1858))(0,0x3f800000,0,0x3f800000,uVar6);
    (**(code **)(lVar7 + 0x538))(4,0,3);
    (**(code **)(lVar7 + 0x518))(uVar5);
    (**(code **)(lVar7 + 0x1680))(0);
    (**(code **)(lVar7 + 0x648))();
    pOVar3 = local_360;
    pRVar2 = ((local_360->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)local_288,&testImage);
    glu::readPixels(pRVar2,0,0,(PixelBufferAccess *)local_288);
    glu::ShaderProgram::~ShaderProgram(&program);
    poVar1 = (ostringstream *)(local_288 + 8);
    local_288._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Expecting black framebuffer.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    tcu::Surface::getAccess((PixelBufferAccess *)local_288,&referenceImage);
    program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x3f80000000000000;
    tcu::clear((PixelBufferAccess *)local_288,(Vec4 *)&program);
    testCtx = (pOVar3->super_PolygonOffsetTestCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx;
    pRVar2 = ((pOVar3->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)local_288,&testImage);
    tcu::Surface::getAccess((PixelBufferAccess *)&program,&referenceImage);
    verifyImages((TestLog *)log,testCtx,pRVar2,(ConstPixelBufferAccess *)local_288,
                 (ConstPixelBufferAccess *)&program);
    tcu::Surface::~Surface(&referenceImage);
    tcu::Surface::~Surface(&testImage);
    return;
  }
  glu::operator<<((TestLog *)log,&program);
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Shader compile failed.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fPolygonOffsetTests.cpp"
             ,0x464);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void OneSlopeTestCase::testPolygonOffset (void)
{
	using tcu::TestLog;

	/*
		* setup vertices subject to following properties
		*   dz_w / dx_w == 1
		*   dz_w / dy_w == 0
		* or
		*   dz_w / dx_w == 0
		*   dz_w / dy_w == 1
		* ==> m == 1
		*/
	const float cornerDepth = float(m_targetSize);
	const tcu::Vec4 triangles[2][3] =
	{
		{
			tcu::Vec4(-1, -1, -cornerDepth, 1),
			tcu::Vec4(-1,  1, -cornerDepth, 1),
			tcu::Vec4( 1, -1,  cornerDepth, 1),
		},
		{
			tcu::Vec4(-1,  1,  cornerDepth, 1),
			tcu::Vec4( 1,  1,  cornerDepth, 1),
			tcu::Vec4( 1, -1, -cornerDepth, 1),
		},
	};

	tcu::TestLog&		log				= m_testCtx.getLog();
	tcu::Surface		testImage		(m_targetSize, m_targetSize);
	tcu::Surface		referenceImage	(m_targetSize, m_targetSize);

	// log triangle info
	log << TestLog::Message << "Setup triangle0 coordinates: (slope in window coordinates = 1.0)" << TestLog::EndMessage;
	for (size_t ndx = 0; ndx < DE_LENGTH_OF_ARRAY(triangles[0]); ++ndx)
		log << TestLog::Message
				<< "\tx=" << triangles[0][ndx].x()
				<< "\ty=" << triangles[0][ndx].y()
				<< "\tz=" << triangles[0][ndx].z()
				<< "\tw=" << triangles[0][ndx].w()
				<< TestLog::EndMessage;
	log << TestLog::Message << "Setup triangle1 coordinates: (slope in window coordinates = 1.0)" << TestLog::EndMessage;
	for (size_t ndx = 0; ndx < DE_LENGTH_OF_ARRAY(triangles[1]); ++ndx)
		log << TestLog::Message
				<< "\tx=" << triangles[1][ndx].x()
				<< "\ty=" << triangles[1][ndx].y()
				<< "\tz=" << triangles[1][ndx].z()
				<< "\tw=" << triangles[1][ndx].w()
				<< TestLog::EndMessage;

	// render test image
	{
		const glw::Functions&		gl			= m_context.getRenderContext().getFunctions();
		const glu::ShaderProgram	program		(m_context.getRenderContext(), glu::makeVtxFragSources(s_shaderSourceVertex, s_shaderSourceFragment));
		const GLint					positionLoc = gl.getAttribLocation(program.getProgram(), "a_position");
		const GLint					colorLoc	= gl.getAttribLocation(program.getProgram(), "a_color");

		if (!program.isOk())
		{
			log << program;
			TCU_FAIL("Shader compile failed.");
		}

		gl.clearColor				(0, 0, 0, 1);
		gl.clear					(GL_COLOR_BUFFER_BIT);
		gl.viewport					(0, 0, m_targetSize, m_targetSize);
		gl.useProgram				(program.getProgram());
		gl.enable					(GL_DEPTH_TEST);
		gl.enable					(GL_POLYGON_OFFSET_FILL);
		gl.enableVertexAttribArray	(positionLoc);

		log << TestLog::Message << "Framebuffer cleared, clear color = Black." << TestLog::EndMessage;
		log << TestLog::Message << "POLYGON_OFFSET_FILL enabled." << TestLog::EndMessage;

		// top left (positive offset)
		{
			log << TestLog::Message << "Clear depth to 1.0." << TestLog::EndMessage;

			gl.clearDepthf			(1.0f); // far
			gl.clear				(GL_DEPTH_BUFFER_BIT);

			gl.vertexAttribPointer	(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, triangles[0]);

			log << TestLog::Message << "Draw triangle0. Color = Red.\tState: DepthFunc = NOTEQUAL, PolygonOffset(10, 0). (Result depth should clamp to 1.0)." << TestLog::EndMessage;

			gl.polygonOffset		(10, 0);		// clamps any depth on the triangle to 1
			gl.depthFunc			(GL_NOTEQUAL);
			gl.vertexAttrib4f		(colorLoc, 1.0f, 0.0f, 0.0f, 1.0f);
			gl.drawArrays			(GL_TRIANGLES, 0, 3);
		}
		// bottom right (negative offset)
		{
			log << TestLog::Message << "Clear depth to 0.0." << TestLog::EndMessage;

			gl.clearDepthf			(0.0f); // far
			gl.clear				(GL_DEPTH_BUFFER_BIT);

			gl.vertexAttribPointer	(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, triangles[1]);

			log << TestLog::Message << "Draw triangle1. Color = Green.\tState: DepthFunc = NOTEQUAL, PolygonOffset(-10, 0). (Result depth should clamp to 0.0)." << TestLog::EndMessage;

			gl.polygonOffset		(-10, 0); // clamps depth to 0
			gl.depthFunc			(GL_NOTEQUAL);
			gl.vertexAttrib4f		(colorLoc, 0.0f, 1.0f, 0.0f, 1.0f);
			gl.drawArrays			(GL_TRIANGLES, 0, 3);
		}

		gl.disableVertexAttribArray	(positionLoc);
		gl.useProgram				(0);
		gl.finish					();

		glu::readPixels(m_context.getRenderContext(), 0, 0, testImage.getAccess());
	}

	// render reference image
	log << TestLog::Message << "Expecting black framebuffer." << TestLog::EndMessage;
	tcu::clear(referenceImage.getAccess(), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	// compare
	verifyImages(log, m_testCtx, m_context.getRenderContext(), testImage.getAccess(), referenceImage.getAccess());
}